

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.cpp
# Opt level: O0

void luaT_init(lua_State *L)

{
  char *str;
  size_t l;
  TString *pTVar1;
  int local_14;
  int i;
  lua_State *L_local;
  
  for (local_14 = 0; local_14 < 0x11; local_14 = local_14 + 1) {
    str = luaT_init::luaT_eventname[local_14];
    l = strlen(luaT_init::luaT_eventname[local_14]);
    pTVar1 = luaS_newlstr(L,str,l);
    L->l_G->tmname[local_14] = pTVar1;
    pTVar1 = L->l_G->tmname[local_14];
    (pTVar1->tsv).marked = (pTVar1->tsv).marked | 0x20;
  }
  return;
}

Assistant:

void luaT_init (lua_State *L) {
  static const char *const luaT_eventname[] = {  /* ORDER TM */
    "__index", "__newindex",
    "__gc", "__mode", "__eq",
    "__add", "__sub", "__mul", "__div", "__mod",
    "__pow", "__unm", "__len", "__lt", "__le",
    "__concat", "__call"
  };
  int i;
  for (i=0; i<TM_N; i++) {
    G(L)->tmname[i] = luaS_new(L, luaT_eventname[i]);
    luaS_fix(G(L)->tmname[i]);  /* never collect these names */
  }
}